

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O0

bool __thiscall
sisl::sparse_array_n<unsigned_int,_3,_std::allocator<unsigned_int>_>::dump_to_stream
          (sparse_array_n<unsigned_int,_3,_std::allocator<unsigned_int>_> *this,ofstream *stream)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  pointer pvVar4;
  uint local_48;
  int local_44;
  uint val;
  int key;
  _Node_iterator_base<std::pair<const_int,_unsigned_int>,_false> local_38;
  const_iterator it;
  int local_28;
  int i;
  uint size;
  uint sig;
  ofstream *stream_local;
  sparse_array_n<unsigned_int,_3,_std::allocator<unsigned_int>_> *this_local;
  
  _size = stream;
  stream_local = (ofstream *)this;
  uVar2 = std::ios::good();
  if ((uVar2 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    i = 0x53534c53;
    local_28 = 1;
    for (it.super__Node_iterator_base<std::pair<const_int,_unsigned_int>,_false>._M_cur._4_4_ = 0;
        it.super__Node_iterator_base<std::pair<const_int,_unsigned_int>,_false>._M_cur._4_4_ < 3;
        it.super__Node_iterator_base<std::pair<const_int,_unsigned_int>,_false>._M_cur._4_4_ =
             it.super__Node_iterator_base<std::pair<const_int,_unsigned_int>,_false>._M_cur._4_4_ +
             1) {
      local_28 = this->_dims
                 [it.super__Node_iterator_base<std::pair<const_int,_unsigned_int>,_false>._M_cur.
                  _4_4_] * local_28;
    }
    std::ostream::write((char *)_size,(long)&i);
    std::ostream::write((char *)_size,(long)this->_dims);
    sVar3 = std::
            unordered_map<int,_unsigned_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
            ::size(&this->siteMap);
    local_28 = (int)sVar3;
    std::ostream::write((char *)_size,(long)&local_28);
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_unsigned_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
         ::begin(&this->siteMap);
    while( true ) {
      _val = (__node_type *)
             std::
             unordered_map<int,_unsigned_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::end(&this->siteMap);
      bVar1 = std::__detail::operator!=
                        (&local_38,
                         (_Node_iterator_base<std::pair<const_int,_unsigned_int>,_false> *)&val);
      if (!bVar1) break;
      pvVar4 = std::__detail::_Node_const_iterator<std::pair<const_int,_unsigned_int>,_false,_false>
               ::operator->((_Node_const_iterator<std::pair<const_int,_unsigned_int>,_false,_false>
                             *)&local_38);
      local_44 = pvVar4->first;
      pvVar4 = std::__detail::_Node_const_iterator<std::pair<const_int,_unsigned_int>,_false,_false>
               ::operator->((_Node_const_iterator<std::pair<const_int,_unsigned_int>,_false,_false>
                             *)&local_38);
      local_48 = pvVar4->second;
      std::ostream::write((char *)_size,(long)&local_44);
      std::ostream::write((char *)_size,(long)&local_48);
      std::__detail::_Node_const_iterator<std::pair<const_int,_unsigned_int>,_false,_false>::
      operator++((_Node_const_iterator<std::pair<const_int,_unsigned_int>,_false,_false> *)&local_38
                );
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool dump_to_stream(std::ofstream &stream) const {
            if(!stream.good()) return false;

            unsigned int sig = 0x53534c53;

            unsigned int size = 1;
            for(int i = 0; i < N; i++) {
                size *= _dims[i];
            }

            stream.write((const char *)&sig, sizeof(unsigned int));
            stream.write((const char *)&_dims[0], N*sizeof(unsigned int));

            size = siteMap.size();
            stream.write((const char *)&size, sizeof(unsigned int));

            for(auto it = siteMap.begin(); it != siteMap.end(); ++it) {
                int key = it->first;
                T val = it->second;

                stream.write((const char *)&key, sizeof(unsigned int));
                stream.write((const char *)&val, sizeof(T));
            }

            return true;
        }